

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::UncommittedReads
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  bool bVar1;
  GLenum err;
  bool local_43;
  bool local_42;
  int local_34;
  bool local_2d;
  int l;
  bool result;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  UncommittedRegionsAccessTestCase *this_local;
  
  local_2d = true;
  bVar1 = readsAllowed(this,target,format,false);
  if (bVar1) {
    std::operator<<((ostream *)
                    &(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.field_0x88,"API Reads - ");
    local_2d = verifyTextureDataExtended(this,gl,target,format,texture,level,false);
  }
  if ((local_2d != false) && (bVar1 = readsAllowed(this,target,format,true), bVar1)) {
    std::operator<<((ostream *)
                    &(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.field_0x88,"Shader Reads - ");
    local_42 = false;
    if (local_2d != false) {
      local_42 = verifyTextureDataExtended(this,gl,target,format,texture,level,true);
    }
    local_2d = local_42;
  }
  if ((((local_2d != false) && (level == 0)) && (target != 0x84f5)) &&
     ((target != 0x9100 && (target != 0x9102)))) {
    std::operator<<((ostream *)
                    &(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.field_0x88,"Mipmap Generate - ");
    gl4cts::Texture::Bind(gl,*texture,target);
    (*gl->generateMipmap)(target);
    err = (*gl->getError)();
    glu::checkError(err,"glGenerateMipmap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x5cc);
    for (local_34 = 1;
        local_34 <
        (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        levels; local_34 = local_34 + 1) {
      local_43 = false;
      if (local_2d != false) {
        local_43 = verifyTextureDataExtended(this,gl,target,format,texture,0,false);
      }
      local_2d = local_43;
    }
  }
  return local_2d;
}

Assistant:

bool UncommittedRegionsAccessTestCase::UncommittedReads(const Functions& gl, GLint target, GLint format,
														GLuint& texture, GLint level)
{
	bool result = true;

	// Verify using API glGetTexImage*
	if (readsAllowed(target, format, false))
	{
		mLog << "API Reads - ";
		result = result && verifyTextureDataExtended(gl, target, format, texture, level, false);
	}

	// Verify using shader imageLoad function
	if (result && readsAllowed(target, format, true))
	{
		mLog << "Shader Reads - ";
		result = result && verifyTextureDataExtended(gl, target, format, texture, level, true);
	}

	// Verify mipmap generating
	if (result && level == 0 && target != GL_TEXTURE_RECTANGLE && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		mLog << "Mipmap Generate - ";
		Texture::Bind(gl, texture, target);
		gl.generateMipmap(target);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap");

		for (int l = 1; l < mState.levels; ++l)
			result = result && verifyTextureDataExtended(gl, target, format, texture, level, false);
	}

	return result;
}